

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_iterator.hpp
# Opt level: O1

void __thiscall
jsoncons::
staj_array_iterator<ns::employee_NCGN,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::next(staj_array_iterator<ns::employee_NCGN,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
       *this,error_code *ec)

{
  basic_staj_cursor<char> *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  error_code *in_R8;
  employee_NCGN local_48;
  
  if (this->done_ == false) {
    iVar2 = (*this->view_->cursor_->_vptr_basic_staj_cursor[3])();
    if ((((char)iVar2 == '\0') &&
        (pbVar1 = this->view_->cursor_, (*pbVar1->_vptr_basic_staj_cursor[8])(pbVar1,ec),
        ec->_M_value == 0)) &&
       (iVar2 = (*this->view_->cursor_->_vptr_basic_staj_cursor[4])(),
       *(char *)CONCAT44(extraout_var,iVar2) != '\x0f')) {
      local_48.name_._M_dataplus._M_p = (pointer)(this->eptr_)._M_exception_object;
      (this->eptr_)._M_exception_object = (void *)0x0;
      if (local_48.name_._M_dataplus._M_p != (pointer)0x0) {
        std::__exception_ptr::exception_ptr::_M_release();
      }
      decode_traits<ns::employee_NCGN,char,void>::
      decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                (&local_48,(decode_traits<ns::employee_NCGN,char,void> *)this->view_->cursor_,
                 (basic_staj_cursor<char> *)&this->view_->decoder_,
                 (json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)ec,in_R8);
      staj_array_iterator<ns::employee_NCGN,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
      ::next();
    }
    else {
      this->done_ = true;
    }
  }
  return;
}

Assistant:

void next(std::error_code& ec)
        {
            if (JSONCONS_UNLIKELY(done_))
            {
                return;
            }
            if (view_->cursor_->done())
            {
                done_ = true;
                return;
            }
            view_->cursor_->next(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                done_ = true;
                return;
            }
            if (JSONCONS_UNLIKELY(view_->cursor_->current().event_type() == staj_event_type::end_array))
            {
                done_ = true;
                return;
            }
            eptr_ = std::exception_ptr();
            JSONCONS_TRY
            {
                view_->value_ = decode_traits<T,char_type>::decode(*view_->cursor_, view_->decoder_, ec);
            }